

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O1

bool __thiscall
MipsParser::parseRegisterTable
          (MipsParser *this,Parser *parser,MipsRegisterValue *dest,MipsRegisterDescriptor *table,
          size_t count)

{
  TokenType TVar1;
  void *__s1;
  size_t __n;
  char *__s;
  int iVar2;
  Token *pTVar3;
  size_t sVar4;
  size_type __rlen;
  int *piVar5;
  bool bVar6;
  
  bVar6 = false;
  pTVar3 = Tokenizer::peekToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  TVar1 = pTVar3->type;
  pTVar3 = Tokenizer::peekToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,
                      (uint)(TVar1 == Dollar));
  if (pTVar3->type == Identifier) {
    if (*(__index_type *)
         ((long)&(pTVar3->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) != '\x04') {
      __assert_fail("std::holds_alternative<Identifier>(value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                    ,0x4d,"const Identifier &Token::identifierValue() const");
    }
    bVar6 = count != 0;
    if (bVar6) {
      __s1 = *(void **)&(pTVar3->value).
                        super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        ._M_u;
      __n = *(size_t *)
             ((long)&(pTVar3->value).
                     super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                     super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
             + 8);
      piVar5 = &table->num;
      do {
        __s = ((MipsRegisterDescriptor *)(piVar5 + -2))->name;
        sVar4 = strlen(__s);
        if ((__n == sVar4) && ((__n == 0 || (iVar2 = bcmp(__s1,__s,__n), iVar2 == 0)))) {
          std::__cxx11::string::_M_assign((string *)&dest->name);
          dest->num = *piVar5;
          Tokenizer::eatTokens
                    ((parser->entries).
                     super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,(TVar1 == Dollar) + 1);
          return true;
        }
        piVar5 = piVar5 + 4;
        count = count - 1;
      } while (count != 0);
      bVar6 = false;
    }
  }
  return bVar6;
}

Assistant:

bool MipsParser::parseRegisterTable(Parser& parser, MipsRegisterValue& dest, const MipsRegisterDescriptor* table, size_t count)
{
	int offset = 0;
	bool hasDollar = parser.peekToken().type == TokenType::Dollar;
	if (hasDollar)
		offset = 1;

	const Token &token = parser.peekToken(offset);

	if (token.type != TokenType::Identifier)
		return false;

	const auto &identifier = token.identifierValue();
	for (size_t i = 0; i < count; i++)
	{
		if (identifier == table[i].name)
		{
			dest.name = identifier;
			dest.num = table[i].num;
			parser.eatTokens(hasDollar ? 2 : 1);
			return true;
		}
	}

	return false;
}